

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O3

reference __thiscall
duckdb::vector<std::reference_wrapper<duckdb::ConstantFilter>,_true>::operator[]
          (vector<std::reference_wrapper<duckdb::ConstantFilter>,_true> *this,size_type __n)

{
  pointer prVar1;
  InternalException *this_00;
  ulong params_1;
  string local_48;
  
  prVar1 = (this->
           super_vector<std::reference_wrapper<duckdb::ConstantFilter>,_std::allocator<std::reference_wrapper<duckdb::ConstantFilter>_>_>
           ).
           super__Vector_base<std::reference_wrapper<duckdb::ConstantFilter>,_std::allocator<std::reference_wrapper<duckdb::ConstantFilter>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  params_1 = (long)(this->
                   super_vector<std::reference_wrapper<duckdb::ConstantFilter>,_std::allocator<std::reference_wrapper<duckdb::ConstantFilter>_>_>
                   ).
                   super__Vector_base<std::reference_wrapper<duckdb::ConstantFilter>,_std::allocator<std::reference_wrapper<duckdb::ConstantFilter>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)prVar1 >> 3;
  if (__n < params_1) {
    return prVar1 + __n;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Attempted to access index %ld within vector of size %ld","");
  InternalException::InternalException<unsigned_long,unsigned_long>(this_00,&local_48,__n,params_1);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

typename original::reference operator[](typename original::size_type __n) { // NOLINT: hiding on purpose
		return get<SAFE>(__n);
	}